

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  doh_probes *pdVar3;
  curl_trc_feat *pcVar4;
  sockaddr *psVar5;
  ushort uVar6;
  ushort uVar7;
  undefined8 uVar8;
  short sVar9;
  DOHcode DVar10;
  CURLcode CVar11;
  int iVar12;
  uchar *puVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  Curl_addrinfo *pCVar17;
  Curl_dns_entry *pCVar18;
  sa_family_t sVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  uint uVar23;
  long lVar24;
  Curl_addrinfo *pCVar25;
  uint uVar26;
  dynbuf *s_00;
  DNStype DVar27;
  ushort uVar28;
  anon_union_16_2_f9ece763_for_ip *paVar29;
  size_t sVar30;
  ulong uVar31;
  bool bVar32;
  Curl_addrinfo *local_388;
  dohentry *local_368;
  DOHcode rc [2];
  uint local_328 [34];
  dohentry de;
  
  pdVar3 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar3 == (doh_probes *)0x0) {
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar3->probe[0].easy_mid < 0) && (pdVar3->probe[1].easy_mid < 0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    CVar11 = (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar11 = CURLE_OK;
    if (pdVar3->pending == 0) {
      rc[0] = DOH_OK;
      rc[1] = DOH_OK;
      Curl_doh_close(data);
      local_368 = &de;
      memset(local_368,0,0x270);
      de.ttl = 0x7fffffff;
      for (lVar24 = 0; lVar24 != 0x80; lVar24 = lVar24 + 0x20) {
        Curl_dyn_init((dynbuf *)((long)&de.cname[0].bufr + lVar24),0x100);
      }
      lVar24 = 0;
LAB_00121f8d:
      if (lVar24 != 2) {
        if (pdVar3->probe[lVar24].dnstype != 0) {
          s = &pdVar3->probe[lVar24].resp_body;
          puVar13 = Curl_dyn_uptr(s);
          sVar14 = Curl_dyn_len(s);
          DVar2 = pdVar3->probe[lVar24].dnstype;
          local_328[0] = 0xc;
          DVar10 = DOH_TOO_SMALL_BUFFER;
          if ((((0xb < sVar14) && (DVar10 = DOH_DNS_BAD_ID, puVar13 != (uchar *)0x0)) &&
              (*puVar13 == '\0')) &&
             ((puVar13[1] == '\0' && (DVar10 = DOH_DNS_BAD_RCODE, (puVar13[3] & 0xf) == 0)))) {
            uVar28 = *(ushort *)(puVar13 + 4) << 8 | *(ushort *)(puVar13 + 4) >> 8;
            sVar30 = 0xc;
            uVar23 = local_328[0];
            do {
              local_328[0] = uVar23;
              bVar32 = uVar28 == 0;
              uVar28 = uVar28 - 1;
              if (bVar32) {
                uVar28 = *(ushort *)(puVar13 + 6) << 8 | *(ushort *)(puVar13 + 6) >> 8;
                DVar27 = 0;
                uVar23 = local_328[0];
                goto LAB_00122090;
              }
              DVar10 = doh_skipqname(puVar13,sVar14,local_328);
              if (DVar10 != DOH_OK) goto LAB_00122498;
              sVar30 = (size_t)(local_328[0] + 4);
              uVar23 = local_328[0] + 4;
            } while (sVar30 <= sVar14);
            DVar10 = DOH_DNS_OUT_OF_RANGE;
          }
          goto LAB_00122498;
        }
        goto LAB_00122525;
      }
      if ((rc[0] == DOH_OK) || (rc[1] == DOH_OK)) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ) && (0 < Curl_doh_trc.log_level)))) {
          Curl_infof(data,"[DoH] hostname: %s",pdVar3->host);
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"[DoH] TTL: %u seconds",(ulong)de.ttl);
          }
          puVar13 = de.addr[0].ip.v4 + 1;
          for (lVar24 = 0; lVar24 < de.numaddr; lVar24 = lVar24 + 1) {
            iVar12 = de.addr[lVar24].type;
            if (iVar12 == 0x1c) {
              iVar12 = curl_msnprintf((char *)local_328,0x80,"[DoH] AAAA: ");
              pcVar21 = (char *)((long)local_328 + (long)iVar12);
              sVar14 = 0x80 - (long)iVar12;
              for (uVar31 = 0; uVar31 < 0x10; uVar31 = uVar31 + 2) {
                pcVar22 = ":";
                if (uVar31 == 0) {
                  pcVar22 = "";
                }
                curl_msnprintf(pcVar21,sVar14,"%s%02x%02x",pcVar22,(ulong)puVar13[uVar31 - 1]);
                sVar16 = strlen(pcVar21);
                sVar14 = sVar14 - sVar16;
                pcVar21 = pcVar21 + sVar16;
              }
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"%s",local_328);
              }
            }
            else if (((iVar12 == 1) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                    ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar4->log_level)))) {
              Curl_infof(data,"[DoH] A: %u.%u.%u.%u",(ulong)de.addr[lVar24].ip.v4[0],
                         (ulong)de.addr[lVar24].ip.v4[1],(ulong)de.addr[lVar24].ip.v4[2]);
            }
            puVar13 = puVar13 + 0x14;
          }
          for (lVar24 = 0; lVar24 < de.numcname; lVar24 = lVar24 + 1) {
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              pcVar21 = Curl_dyn_ptr(local_368->cname);
              Curl_infof(data,"CNAME: %s",pcVar21);
            }
            local_368 = (dohentry *)(local_368->cname + 1);
          }
        }
        pcVar21 = pdVar3->host;
        sVar16 = strlen(pcVar21);
        if (de.numaddr == 0) {
          CVar11 = CURLE_COULDNT_RESOLVE_HOST;
LAB_001229e8:
          de_cleanup(&de);
          return CVar11;
        }
        uVar28 = (ushort)pdVar3->port;
        paVar29 = &de.addr[0].ip;
        local_388 = (Curl_addrinfo *)0x0;
        pCVar25 = (Curl_addrinfo *)0x0;
        for (lVar24 = 0; lVar24 < de.numaddr; lVar24 = lVar24 + 1) {
          iVar12 = ((dohaddr *)((long)paVar29 + -4))->type;
          lVar20 = 0x1c;
          if (iVar12 != 0x1c) {
            lVar20 = 0x10;
          }
          pCVar17 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar16 + 0x31 + lVar20);
          if (pCVar17 == (Curl_addrinfo *)0x0) {
            Curl_freeaddrinfo(local_388);
            CVar11 = CURLE_OUT_OF_MEMORY;
            goto LAB_001229e8;
          }
          pCVar17->ai_addr = (sockaddr *)(pCVar17 + 1);
          pcVar22 = (char *)((long)&pCVar17[1].ai_flags + lVar20);
          pCVar17->ai_canonname = pcVar22;
          memcpy(pcVar22,pcVar21,sVar16 + 1);
          if (local_388 == (Curl_addrinfo *)0x0) {
            local_388 = pCVar17;
          }
          if (pCVar25 != (Curl_addrinfo *)0x0) {
            pCVar25->ai_next = pCVar17;
          }
          pCVar17->ai_family = (uint)(iVar12 == 0x1c) * 8 + 2;
          pCVar17->ai_socktype = 1;
          pCVar17->ai_addrlen = (curl_socklen_t)lVar20;
          psVar5 = pCVar17->ai_addr;
          if (iVar12 == 0x1c) {
            uVar8 = *(undefined8 *)((long)paVar29 + 8);
            *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)paVar29;
            psVar5[1].sa_family = (short)uVar8;
            psVar5[1].sa_data[0] = (char)((ulong)uVar8 >> 0x10);
            psVar5[1].sa_data[1] = (char)((ulong)uVar8 >> 0x18);
            psVar5[1].sa_data[2] = (char)((ulong)uVar8 >> 0x20);
            psVar5[1].sa_data[3] = (char)((ulong)uVar8 >> 0x28);
            psVar5[1].sa_data[4] = (char)((ulong)uVar8 >> 0x30);
            psVar5[1].sa_data[5] = (char)((ulong)uVar8 >> 0x38);
            sVar19 = 10;
          }
          else {
            *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)paVar29;
            sVar19 = 2;
          }
          psVar5->sa_family = sVar19;
          *(ushort *)psVar5->sa_data = uVar28 << 8 | uVar28 >> 8;
          paVar29 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar29 + 0x14);
          pCVar25 = pCVar17;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pCVar18 = Curl_cache_addr(data,local_388,pdVar3->host,0,pdVar3->port,false);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar18 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(local_388);
        }
        else {
          (data->state).async.dns = pCVar18;
          *dnsp = pCVar18;
        }
        CVar11 = CURLE_OK;
      }
      else {
        CVar11 = CURLE_COULDNT_RESOLVE_HOST;
      }
      de_cleanup(&de);
      Curl_doh_cleanup(data);
    }
  }
  return CVar11;
LAB_00122090:
  do {
    local_328[0] = uVar23;
    bVar32 = uVar28 == 0;
    uVar28 = uVar28 - 1;
    if (bVar32) {
      uVar28 = *(ushort *)(puVar13 + 8) << 8 | *(ushort *)(puVar13 + 8) >> 8;
      uVar23 = local_328[0];
      goto LAB_0012236f;
    }
    DVar10 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar10 != DOH_OK) goto LAB_00122498;
    if (sVar14 < local_328[0] + 2) goto LAB_00122494;
    uVar6 = CONCAT11(puVar13[local_328[0]],puVar13[local_328[0] + 1]);
    DVar27 = (DNStype)uVar6;
    if (((DVar27 != DNS_TYPE_CNAME) && (DVar27 != DNS_TYPE_DNAME)) && (DVar2 != DVar27)) {
      DVar10 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_00122498;
    }
    if (sVar14 < local_328[0] + 4) goto LAB_00122494;
    if (CONCAT11(puVar13[local_328[0] + 2],puVar13[local_328[0] + 3]) != 1) {
      DVar10 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_00122498;
    }
    if (sVar14 < local_328[0] + 8) goto LAB_00122494;
    uVar23 = *(uint *)(puVar13 + (local_328[0] + 4));
    uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
    if (uVar23 < de.ttl) {
      de.ttl = uVar23;
    }
    uVar26 = local_328[0] + 10;
    uVar31 = (ulong)uVar26;
    if (sVar14 < uVar31) goto LAB_00122494;
    uVar7 = CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]);
    uVar23 = uVar26 + uVar7;
    sVar30 = (size_t)uVar23;
    if (sVar14 < sVar30) goto LAB_00122494;
    if (uVar6 == 0x1c) {
      if (uVar7 != 0x10) {
LAB_00122408:
        DVar10 = DOH_DNS_RDATA_LEN;
        goto LAB_00122498;
      }
      lVar20 = (long)de.numaddr;
      if (lVar20 < 0x18) {
        de.addr[lVar20].type = 0x1c;
        uVar8 = *(undefined8 *)(puVar13 + (int)uVar26 + 8);
        *(undefined8 *)&de.addr[lVar20].ip = *(undefined8 *)(puVar13 + (int)uVar26);
        *(undefined8 *)((long)&de.addr[lVar20].ip + 8) = uVar8;
LAB_00122333:
        de.numaddr = de.numaddr + 1;
      }
      goto LAB_00122090;
    }
    sVar9 = CONCAT11(puVar13[local_328[0]],puVar13[local_328[0] + 1]);
    if (sVar9 != 5) {
      if (sVar9 == 1) {
        if (uVar7 != 4) goto LAB_00122408;
        lVar20 = (long)de.numaddr;
        if (lVar20 < 0x18) {
          de.addr[lVar20].type = 1;
          *(undefined4 *)&de.addr[lVar20].ip = *(undefined4 *)(puVar13 + (int)uVar26);
          goto LAB_00122333;
        }
      }
      goto LAB_00122090;
    }
    lVar20 = (long)de.numcname;
    if (lVar20 == 4) goto LAB_00122090;
    de.numcname = de.numcname + 1;
    s_00 = de.cname + lVar20;
    iVar12 = -0x7f;
    do {
      if (sVar14 <= uVar31) goto LAB_00122494;
      bVar1 = puVar13[uVar31];
      if ((bVar1 & 0xc0) == 0) {
        uVar26 = (int)uVar31 + 1;
        uVar31 = (ulong)uVar26;
        if ((ulong)bVar1 != 0) {
          sVar15 = Curl_dyn_len(s_00);
          if ((sVar15 == 0) || (CVar11 = Curl_dyn_addn(s_00,".",1), CVar11 == CURLE_OK)) {
            uVar31 = (ulong)(bVar1 + uVar26);
            if (sVar14 < uVar31) goto LAB_001223fa;
            CVar11 = Curl_dyn_addn(s_00,puVar13 + uVar26,(ulong)bVar1);
            if (CVar11 == CURLE_OK) goto LAB_001222e4;
          }
          DVar10 = DOH_OUT_OF_MEM;
          goto LAB_00122498;
        }
      }
      else {
        if ((bVar1 & 0xc0) != 0xc0) {
LAB_001223fa:
          DVar10 = DOH_DNS_BAD_LABEL;
          goto LAB_00122498;
        }
        uVar31 = (ulong)((int)uVar31 + 1);
        if (sVar14 <= uVar31) goto LAB_00122494;
        uVar31 = (ulong)((uint)puVar13[uVar31] | (bVar1 & 0x3f) << 8);
      }
LAB_001222e4:
    } while ((bVar1 != 0) && (bVar32 = iVar12 != 0, iVar12 = iVar12 + 1, bVar32));
  } while (bVar1 == 0);
  DVar10 = DOH_DNS_LABEL_LOOP;
  goto LAB_00122498;
  while( true ) {
    uVar23 = (uint)CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]) + local_328[0] + 10
    ;
    sVar30 = (size_t)uVar23;
    if (sVar14 < sVar30) break;
LAB_0012236f:
    local_328[0] = uVar23;
    bVar32 = uVar28 == 0;
    uVar28 = uVar28 - 1;
    if (bVar32) {
      uVar28 = *(ushort *)(puVar13 + 10) << 8 | *(ushort *)(puVar13 + 10) >> 8;
      uVar23 = local_328[0];
      goto LAB_0012241f;
    }
    DVar10 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar10 != DOH_OK) goto LAB_00122498;
    if ((sVar14 < local_328[0] + 8) || (sVar14 < local_328[0] + 10)) break;
  }
  goto LAB_00122494;
  while( true ) {
    uVar23 = (uint)CONCAT11(puVar13[local_328[0] + 8],puVar13[local_328[0] + 9]) + local_328[0] + 10
    ;
    sVar30 = (size_t)uVar23;
    if (sVar14 < sVar30) break;
LAB_0012241f:
    local_328[0] = uVar23;
    bVar32 = uVar28 == 0;
    uVar28 = uVar28 - 1;
    if (bVar32) {
      DVar10 = DOH_DNS_MALFORMAT;
      if (sVar14 == sVar30) {
        DVar10 = DOH_OK;
        if (de.numaddr == 0 && de.numcname == 0) {
          DVar10 = DOH_NO_CONTENT;
        }
        if ((short)DVar27 == 2) {
          DVar10 = DOH_OK;
        }
      }
      goto LAB_00122498;
    }
    DVar10 = doh_skipqname(puVar13,sVar14,local_328);
    if (DVar10 != DOH_OK) goto LAB_00122498;
    if ((sVar14 < local_328[0] + 8) || (sVar14 < local_328[0] + 10)) break;
  }
LAB_00122494:
  DVar10 = DOH_DNS_OUT_OF_RANGE;
LAB_00122498:
  rc[lVar24] = DVar10;
  Curl_dyn_free(s);
  if ((((data != (Curl_easy *)0x0) && (DVar10 != DOH_OK)) && (((data->set).field_0x8cd & 0x10) != 0)
      ) && ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
    DVar2 = pdVar3->probe[lVar24].dnstype;
    pcVar21 = "unknown";
    if (DVar2 == DNS_TYPE_AAAA) {
      pcVar21 = "AAAA";
    }
    if (DVar2 == DNS_TYPE_A) {
      pcVar21 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar10],
               pcVar21);
  }
LAB_00122525:
  lVar24 = lVar24 + 1;
  goto LAB_00121f8d;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe[DOH_SLOT_IPV4].easy_mid < 0 &&
     dohp->probe[DOH_SLOT_IPV6].easy_mid < 0) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_probe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->resp_body),
                                 Curl_dyn_len(&p->resp_body),
                                 p->dnstype, &de);
      Curl_dyn_free(&p->resp_body);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_doh_trc)) {
        infof(data, "[DoH] hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port, FALSE);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */
#ifdef USE_HTTPSRR
    if(de.numhttps_rrs > 0 && result == CURLE_OK && *dnsp) {
      struct Curl_https_rrinfo *hrr = NULL;
      result = doh_resp_decode_httpsrr(de.https_rrs->val, de.https_rrs->len,
                                       &hrr);
      if(result) {
        infof(data, "Failed to decode HTTPS RR");
        return result;
      }
      infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
      doh_print_httpsrr(data, hrr);
# endif
      (*dnsp)->hinfo = hrr;
    }
#endif

    /* All done */
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}